

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

string * stripExportInterface
                   (string *__return_storage_ptr__,string *input,PreprocessContext context,
                   bool resolveRelative)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  ulong local_1b8;
  string local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  char *local_118;
  size_type traversed;
  string local_108;
  undefined1 local_e8 [8];
  string content;
  char *cStart;
  char *c;
  bool gotInstallInterface;
  string local_88 [32];
  ulong local_68;
  size_type iPos;
  size_type bPos;
  size_type lastPos;
  size_type pos;
  undefined1 local_40 [4];
  int nestingLevel;
  string result;
  bool resolveRelative_local;
  PreprocessContext context_local;
  string *input_local;
  
  result.field_2._M_local_buf[0xb] = resolveRelative;
  result.field_2._12_4_ = context;
  std::__cxx11::string::string((string *)local_40);
  pos._4_4_ = 0;
  lastPos = 0;
  do {
    bPos = lastPos;
    iPos = std::__cxx11::string::find((char *)input,0xd3ae6f);
    local_68 = std::__cxx11::string::find((char *)input,0xd63b0f);
    if ((iPos == 0xffffffffffffffff) && (local_68 == 0xffffffffffffffff)) {
      if (pos._4_4_ == 0) {
        std::__cxx11::string::substr((ulong)local_1a0,(ulong)input);
        std::__cxx11::string::operator+=((string *)local_40,local_1a0);
        std::__cxx11::string::~string(local_1a0);
      }
      cmGeneratorExpression::StripEmptyListElements(__return_storage_ptr__,(string *)local_40);
      std::__cxx11::string::~string((string *)local_40);
      return __return_storage_ptr__;
    }
    lastPos = local_68;
    if (iPos != 0xffffffffffffffff) {
      if (local_68 == 0xffffffffffffffff) {
        lastPos = iPos;
      }
      else {
        local_1b8 = local_68;
        if (iPos < local_68) {
          local_1b8 = iPos;
        }
        lastPos = local_1b8;
      }
    }
    std::__cxx11::string::substr((ulong)local_88,(ulong)input);
    std::__cxx11::string::operator+=((string *)local_40,local_88);
    std::__cxx11::string::~string(local_88);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    bVar4 = *pcVar2 == 'I';
    lVar3 = 0x12;
    if (bVar4) {
      lVar3 = 0x14;
    }
    lastPos = lVar3 + lastPos;
    pos._4_4_ = 1;
    lVar3 = std::__cxx11::string::c_str();
    pcVar2 = (char *)(lVar3 + lastPos);
    for (cStart = pcVar2; *cStart != '\0'; cStart = cStart + 1) {
      bVar1 = cmGeneratorExpression::StartsWithGeneratorExpression(cStart);
      if (bVar1) {
        pos._4_4_ = pos._4_4_ + 1;
        cStart = cStart + 1;
      }
      else if ((*cStart == '>') && (pos._4_4_ = pos._4_4_ + -1, pos._4_4_ == 0)) {
        if ((result.field_2._12_4_ != 1) || (bVar4)) {
          if ((result.field_2._12_4_ == 2) && (bVar4)) {
            std::__cxx11::string::substr((ulong)local_e8,(ulong)input);
            if ((result.field_2._M_local_buf[0xb] & 1U) == 0) {
              std::__cxx11::string::operator+=((string *)local_40,(string *)local_e8);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_108,"${_IMPORT_PREFIX}/",
                         (allocator<char> *)((long)&traversed + 7));
              prefixItems((string *)local_e8,(string *)local_40,&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::allocator<char>::~allocator((allocator<char> *)((long)&traversed + 7));
            }
            std::__cxx11::string::~string((string *)local_e8);
          }
        }
        else {
          std::__cxx11::string::substr((ulong)((long)&content.field_2 + 8),(ulong)input);
          std::__cxx11::string::operator+=
                    ((string *)local_40,(string *)(content.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(content.field_2._M_local_buf + 8));
        }
        break;
      }
    }
    local_118 = cStart + (1 - (long)pcVar2);
    if (*cStart == '\0') {
      pcVar2 = "$<BUILD_INTERFACE:";
      if (bVar4) {
        pcVar2 = "$<INSTALL_INTERFACE:";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,pcVar2,&local_159);
      std::__cxx11::string::substr((ulong)&local_180,(ulong)input);
      std::operator+(&local_138,&local_158,&local_180);
      std::__cxx11::string::operator+=((string *)local_40,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
    }
    lastPos = (size_type)(local_118 + lastPos);
  } while( true );
}

Assistant:

static std::string stripExportInterface(
  const std::string& input, cmGeneratorExpression::PreprocessContext context,
  bool resolveRelative)
{
  std::string result;

  int nestingLevel = 0;
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;
  while (true) {
    std::string::size_type bPos = input.find("$<BUILD_INTERFACE:", lastPos);
    std::string::size_type iPos = input.find("$<INSTALL_INTERFACE:", lastPos);

    if (bPos == std::string::npos && iPos == std::string::npos) {
      break;
    }

    if (bPos == std::string::npos) {
      pos = iPos;
    } else if (iPos == std::string::npos) {
      pos = bPos;
    } else {
      pos = (bPos < iPos) ? bPos : iPos;
    }

    result += input.substr(lastPos, pos - lastPos);
    const bool gotInstallInterface = input[pos + 2] == 'I';
    pos += gotInstallInterface ? sizeof("$<INSTALL_INTERFACE:") - 1
                               : sizeof("$<BUILD_INTERFACE:") - 1;
    nestingLevel = 1;
    const char* c = input.c_str() + pos;
    const char* const cStart = c;
    for (; *c; ++c) {
      if (cmGeneratorExpression::StartsWithGeneratorExpression(c)) {
        ++nestingLevel;
        ++c;
        continue;
      }
      if (c[0] == '>') {
        --nestingLevel;
        if (nestingLevel != 0) {
          continue;
        }
        if (context == cmGeneratorExpression::BuildInterface &&
            !gotInstallInterface) {
          result += input.substr(pos, c - cStart);
        } else if (context == cmGeneratorExpression::InstallInterface &&
                   gotInstallInterface) {
          const std::string content = input.substr(pos, c - cStart);
          if (resolveRelative) {
            prefixItems(content, result, "${_IMPORT_PREFIX}/");
          } else {
            result += content;
          }
        }
        break;
      }
    }
    const std::string::size_type traversed = (c - cStart) + 1;
    if (!*c) {
      result += std::string(gotInstallInterface ? "$<INSTALL_INTERFACE:"
                                                : "$<BUILD_INTERFACE:") +
        input.substr(pos, traversed);
    }
    pos += traversed;
    lastPos = pos;
  }
  if (nestingLevel == 0) {
    result += input.substr(lastPos);
  }

  return cmGeneratorExpression::StripEmptyListElements(result);
}